

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O3

int32_t uloc_getDisplayKeywordValue_63
                  (char *locale,char *keyword,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  int32_t dispNameLen;
  int32_t local_2bc;
  UChar *local_2b8;
  UResourceBundle *local_2b0;
  char keywordValue [628];
  
  iVar2 = 0;
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0) || (dest == (UChar *)0x0 && destCapacity != 0)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      keywordValue[0] = '\0';
      local_2bc = uloc_getKeywordValue_63(locale,keyword,keywordValue,0x274,status);
      if (*status == U_STRING_NOT_TERMINATED_WARNING) {
        *status = U_BUFFER_OVERFLOW_ERROR;
      }
      iVar1 = uprv_stricmp_63(keyword,"currency");
      if (iVar1 == 0) {
        dispNameLen = 0;
        local_2b0 = ures_open_63("icudt63l-curr",displayLocale,status);
        resB = ures_getByKey_63(local_2b0,"Currencies",(UResourceBundle *)0x0,status);
        resB_00 = ures_getByKeyWithFallback_63(resB,keywordValue,(UResourceBundle *)0x0,status);
        local_2b8 = ures_getStringByIndex_63(resB_00,1,&dispNameLen,status);
        ures_close_63(resB_00);
        ures_close_63(resB);
        ures_close_63(local_2b0);
        iVar2 = local_2bc;
        if (U_ZERO_ERROR < *status) {
          if (*status != U_MISSING_RESOURCE_ERROR) {
            return 0;
          }
          *status = U_USING_DEFAULT_WARNING;
        }
        if (local_2b8 == (UChar *)0x0) {
          if (destCapacity < local_2bc) {
            *status = U_BUFFER_OVERFLOW_ERROR;
            return local_2bc;
          }
          u_charsToUChars_63(keywordValue,dest,local_2bc);
        }
        else {
          if (destCapacity < dispNameLen) {
            *status = U_BUFFER_OVERFLOW_ERROR;
            return dispNameLen;
          }
          u_memcpy_63(dest,local_2b8,dispNameLen);
          iVar2 = dispNameLen;
        }
        iVar2 = u_terminateUChars_63(dest,destCapacity,iVar2,status);
      }
      else {
        iVar2 = _getStringOrCopyKey("icudt63l-lang",displayLocale,"Types",keyword,keywordValue,
                                    keywordValue,dest,destCapacity,status);
      }
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayKeywordValue(   const char* locale,
                               const char* keyword,
                               const char* displayLocale,
                               UChar* dest,
                               int32_t destCapacity,
                               UErrorCode* status){


    char keywordValue[ULOC_FULLNAME_CAPACITY*4];
    int32_t capacity = ULOC_FULLNAME_CAPACITY*4;
    int32_t keywordValueLen =0;

    /* argument checking */
    if(status==NULL || U_FAILURE(*status)) {
        return 0;
    }

    if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* get the keyword value */
    keywordValue[0]=0;
    keywordValueLen = uloc_getKeywordValue(locale, keyword, keywordValue, capacity, status);
    if (*status == U_STRING_NOT_TERMINATED_WARNING)
      *status = U_BUFFER_OVERFLOW_ERROR;

    /* 
     * if the keyword is equal to currency .. then to get the display name 
     * we need to do the fallback ourselves
     */
    if(uprv_stricmp(keyword, _kCurrency)==0){

        int32_t dispNameLen = 0;
        const UChar *dispName = NULL;
        
        UResourceBundle *bundle     = ures_open(U_ICUDATA_CURR, displayLocale, status);
        UResourceBundle *currencies = ures_getByKey(bundle, _kCurrencies, NULL, status);
        UResourceBundle *currency   = ures_getByKeyWithFallback(currencies, keywordValue, NULL, status);
        
        dispName = ures_getStringByIndex(currency, UCURRENCY_DISPLAY_NAME_INDEX, &dispNameLen, status);
        
        /*close the bundles */
        ures_close(currency);
        ures_close(currencies);
        ures_close(bundle);
        
        if(U_FAILURE(*status)){
            if(*status == U_MISSING_RESOURCE_ERROR){
                /* we just want to write the value over if nothing is available */
                *status = U_USING_DEFAULT_WARNING;
            }else{
                return 0;
            }
        }

        /* now copy the dispName over if not NULL */
        if(dispName != NULL){
            if(dispNameLen <= destCapacity){
                u_memcpy(dest, dispName, dispNameLen);
                return u_terminateUChars(dest, destCapacity, dispNameLen, status);
            }else{
                *status = U_BUFFER_OVERFLOW_ERROR;
                return dispNameLen;
            }
        }else{
            /* we have not found the display name for the value .. just copy over */
            if(keywordValueLen <= destCapacity){
                u_charsToUChars(keywordValue, dest, keywordValueLen);
                return u_terminateUChars(dest, destCapacity, keywordValueLen, status);
            }else{
                 *status = U_BUFFER_OVERFLOW_ERROR;
                return keywordValueLen;
            }
        }

        
    }else{

        return _getStringOrCopyKey(U_ICUDATA_LANG, displayLocale,
                                   _kTypes, keyword, 
                                   keywordValue,
                                   keywordValue,
                                   dest, destCapacity,
                                   status);
    }
}